

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O0

void bonk_learn(t_bonk *x,t_floatarg f)

{
  t_template_conflict *ptVar1;
  int local_18;
  int n;
  t_floatarg f_local;
  t_bonk *x_local;
  
  local_18 = (int)f;
  if (local_18 < 0) {
    local_18 = 0;
  }
  if (local_18 != 0) {
    ptVar1 = (t_template_conflict *)resizebytes(x->x_template,(long)x->x_ntemplate * 800,0);
    x->x_template = ptVar1;
    x->x_ntemplate = 0;
  }
  x->x_learn = local_18;
  x->x_learncount = 0;
  return;
}

Assistant:

static void bonk_learn(t_bonk *x, t_floatarg f)
{
    int n = f;
    if (n < 0) n = 0;
    if (n)
    {
        x->x_template = (t_template *)t_resizebytes(x->x_template,
            x->x_ntemplate * sizeof(x->x_template[0]), 0);
        x->x_ntemplate = 0;
    }
    x->x_learn = n;
    x->x_learncount = 0;
}